

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void testutil_random_ge_test(secp256k1_ge *ge)

{
  int iVar1;
  long in_RDI;
  secp256k1_fe fe;
  secp256k1_fe *in_stack_ffffffffffffffe0;
  
  do {
    testutil_random_fe_test(in_stack_ffffffffffffffe0);
    testrand_bits((int)((ulong)in_RDI >> 0x20));
    iVar1 = secp256k1_ge_set_xo_var(ge,(secp256k1_fe *)fe.n[4],fe.n[3]._4_4_);
  } while (iVar1 == 0);
  secp256k1_fe_impl_normalize((secp256k1_fe *)(in_RDI + 0x28));
  *(undefined4 *)(in_RDI + 0x50) = 0;
  return;
}

Assistant:

static void testutil_random_ge_test(secp256k1_ge *ge) {
    secp256k1_fe fe;
    do {
        testutil_random_fe_test(&fe);
        if (secp256k1_ge_set_xo_var(ge, &fe, testrand_bits(1))) {
            secp256k1_fe_normalize(&ge->y);
            break;
        }
    } while(1);
    ge->infinity = 0;
}